

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::StencilMaskTestCase::test(StencilMaskTestCase *this)

{
  uint uVar1;
  GLuint mask_00;
  RenderTarget *this_00;
  int local_18;
  int mask;
  int stencilBit;
  int stencilBits;
  StencilMaskTestCase *this_local;
  
  this_00 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar1 = tcu::RenderTarget::getStencilBits(this_00);
  (*this->m_verifier->_vptr_StateVerifier[9])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_testTargetName,(ulong)uVar1);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (local_18 = 0; local_18 < (int)uVar1; local_18 = local_18 + 1) {
    mask_00 = 1 << ((byte)local_18 & 0x1f);
    glu::CallLogWrapper::glStencilFunc(&(this->super_ApiCase).super_CallLogWrapper,0x207,0,mask_00);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_testTargetName,(ulong)mask_00);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		const int stencilBits = m_context.getRenderTarget().getStencilBits();

		m_verifier->verifyStencilMaskInitial(m_testCtx, m_testTargetName, stencilBits);
		expectError(GL_NO_ERROR);

		for (int stencilBit = 0; stencilBit < stencilBits; ++stencilBit)
		{
			const int mask = 1 << stencilBit;

			glStencilFunc(GL_ALWAYS, 0, mask);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, mask);
			expectError(GL_NO_ERROR);
		}
	}